

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_EndpointUrl_split(char *endpointUrl,char *hostname,UA_UInt16 *port,char **path)

{
  char cVar1;
  char *__src;
  UA_StatusCode UVar2;
  size_t i;
  long lVar3;
  char *__n;
  uint local_4c;
  char *pcStack_48;
  UA_UInt32 p;
  char *portTmp;
  char *pathTmp;
  char portStr [6];
  
  pcStack_48 = (char *)0x0;
  portTmp = (char *)0x0;
  UVar2 = UA_EndpointUrl_split_ptr(endpointUrl,hostname,&stack0xffffffffffffffb8,&portTmp);
  __src = pcStack_48;
  if (UVar2 == 0) {
    UVar2 = 0;
    if (port != (UA_UInt16 *)0x0 || path != (char **)0x0) {
      pathTmp._2_1_ = 0;
      if (pcStack_48 == (char *)0x0) {
        if (port != (UA_UInt16 *)0x0) {
          *port = 0;
        }
      }
      else {
        if (portTmp == (char *)0x0) {
          __n = (char *)strlen(pcStack_48);
        }
        else {
          __n = portTmp + ~(ulong)pcStack_48;
        }
        if ((char *)0x5 < __n) {
          return 0x803c0000;
        }
        memcpy((void *)((long)&pathTmp + 2),__src,(size_t)__n);
        __n[(long)&pathTmp + 2] = '\0';
        if (port != (UA_UInt16 *)0x0) {
          lVar3 = 0;
          while ((lVar3 != 6 && (cVar1 = *(char *)((long)&pathTmp + lVar3 + 2), cVar1 != '\0'))) {
            lVar3 = lVar3 + 1;
            if ((byte)(cVar1 - 0x3aU) < 0xf6) {
              return 0x803c0000;
            }
          }
          UA_readNumber((UA_Byte *)((long)&pathTmp + 2),6,&local_4c);
          if (0xffff < local_4c) {
            return 0x803c0000;
          }
          *port = (UA_UInt16)local_4c;
        }
      }
      UVar2 = 0;
      if (path != (char **)0x0) {
        *path = portTmp;
      }
    }
  }
  else if (hostname != (char *)0x0) {
    *hostname = '\0';
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_EndpointUrl_split(const char *endpointUrl, char *hostname,
                     UA_UInt16 * port, const char ** path) {
    const char* portTmp = NULL;
    const char* pathTmp = NULL;
    UA_StatusCode retval = UA_EndpointUrl_split_ptr(endpointUrl, hostname, &portTmp, &pathTmp);
    if(retval != UA_STATUSCODE_GOOD) {
        if(hostname)
            hostname[0] = '\0';
        return retval;
    }
    if(!port && !path)
        return UA_STATUSCODE_GOOD;

    char portStr[6];
    portStr[0] = '\0';
    if(portTmp) {
        size_t portLen;
        if (pathTmp)
            portLen = (size_t)(pathTmp-portTmp-1);
        else
            portLen = strlen(portTmp);

        if (portLen > 5) // max is 65535
            return UA_STATUSCODE_BADOUTOFRANGE;

        memcpy(portStr, portTmp, portLen);
        portStr[portLen]='\0';

        if(port) {
            for (size_t i=0; i<6; ++i) {
                if (portStr[i] == 0)
                    break;
                if (portStr[i] < '0' || portStr[i] > '9')
                    return UA_STATUSCODE_BADOUTOFRANGE;
            }

            UA_UInt32 p;
            UA_readNumber((UA_Byte*)portStr, 6, &p);
            if (p>65535)
                return UA_STATUSCODE_BADOUTOFRANGE;
            *port = (UA_UInt16)p;
        }
    } else {
        if (port)
            *port = 0;
    }
    if (path)
        *path = pathTmp;
    return UA_STATUSCODE_GOOD;
}